

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O0

int Curl_strcasecompare(char *first,char *second)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  char *local_18;
  char *second_local;
  char *first_local;
  
  local_18 = second;
  second_local = first;
  while( true ) {
    bVar3 = false;
    if (*second_local != '\0') {
      bVar3 = *local_18 != '\0';
    }
    if (!bVar3) break;
    cVar1 = Curl_raw_toupper(*second_local);
    cVar2 = Curl_raw_toupper(*local_18);
    if (cVar1 != cVar2) break;
    second_local = second_local + 1;
    local_18 = local_18 + 1;
  }
  cVar1 = Curl_raw_toupper(*second_local);
  cVar2 = Curl_raw_toupper(*local_18);
  return (int)(cVar1 == cVar2);
}

Assistant:

int Curl_strcasecompare(const char *first, const char *second)
{
  while(*first && *second) {
    if(Curl_raw_toupper(*first) != Curl_raw_toupper(*second))
      /* get out of the loop as soon as they don't match */
      break;
    first++;
    second++;
  }
  /* we do the comparison here (possibly again), just to make sure that if the
     loop above is skipped because one of the strings reached zero, we must not
     return this as a successful match */
  return (Curl_raw_toupper(*first) == Curl_raw_toupper(*second));
}